

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O1

bool dg::llvmutils::callIsCompatible(Function *F,CallInst *CI,CallCompatibility policy)

{
  int iVar1;
  long *plVar2;
  char cVar3;
  bool bVar4;
  op_iterator pUVar5;
  CallInst *pCVar6;
  long *plVar7;
  long *plVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  pUVar5 = llvm::CallBase::arg_end((CallBase *)CI);
  iVar1 = *(int *)(CI + 0x14);
  if (policy == MATCHING_ARGS) {
LAB_00115120:
    if (((byte)F[0x12] & 1) != 0) {
      llvm::Function::BuildLazyArguments();
    }
    plVar2 = *(long **)(F + 0x58);
    if (((byte)F[0x12] & 1) != 0) {
      llvm::Function::BuildLazyArguments();
    }
    plVar8 = (long *)(*(long *)(F + 0x60) * 0x28 + *(long *)(F + 0x58));
    uVar10 = (ulong)(pUVar5 + ((ulong)(uint)(iVar1 << 5) - (long)CI)) >> 5 & 0xffffffff;
    bVar4 = plVar2 == plVar8 || uVar10 == 0;
    if (plVar2 != plVar8 && uVar10 != 0) {
      uVar9 = 1;
      pCVar6 = CI;
      do {
        plVar7 = plVar2 + 5;
        if ((((*(uint *)((Type *)**(undefined8 **)
                                   (pCVar6 + -(ulong)(uint)(*(int *)(CI + 0x14) << 5)) + 8) & 0xfd)
              != 0xd) || ((*(uint *)(*plVar2 + 8) & 0xfd) != 0xd)) &&
           (cVar3 = llvm::Type::canLosslesslyBitCastTo
                              ((Type *)**(undefined8 **)
                                         (pCVar6 + -(ulong)(uint)(*(int *)(CI + 0x14) << 5))),
           cVar3 == '\0')) goto LAB_00115202;
        bVar11 = uVar10 <= uVar9;
        bVar4 = plVar7 == plVar8 || bVar11;
        pCVar6 = pCVar6 + 0x20;
        uVar9 = uVar9 + 1;
        plVar2 = plVar7;
      } while (plVar7 != plVar8 && !bVar11);
    }
  }
  else {
    uVar10 = *(ulong *)(F + 0x60);
    uVar9 = (ulong)(pUVar5 + ((ulong)(uint)(iVar1 << 5) - (long)CI)) >> 5 & 0xffffffff;
    if (*(uint *)(*(long *)(F + 0x18) + 8) < 0x100) {
      if (uVar10 != uVar9) {
        if (policy == STRICT) {
          return false;
        }
        if (uVar9 < uVar10) {
          return false;
        }
      }
LAB_00115105:
      cVar3 = llvm::Type::canLosslesslyBitCastTo
                        ((Type *)**(undefined8 **)(*(long *)(F + 0x18) + 0x10));
      if ((cVar3 != '\0') ||
         (((*(uint *)(**(long **)(*(long *)(F + 0x18) + 0x10) + 8) & 0xfd) == 0xd &&
          ((*(uint *)(*(long *)CI + 8) & 0xfd) == 0xd)))) goto LAB_00115120;
    }
    else if (uVar10 <= uVar9) goto LAB_00115105;
LAB_00115202:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

inline bool
callIsCompatible(const Function *F, const CallInst *CI,
                 CallCompatibility policy = CallCompatibility::LOOSE) {
    using namespace llvm;

    auto ci_arg_size = getNumArgOperands(CI);
    if (policy != CallCompatibility::MATCHING_ARGS) {
        if (F->isVarArg()) {
            if (F->arg_size() > ci_arg_size) {
                return false;
            }
        } else if (F->arg_size() != ci_arg_size) {
            if (policy == CallCompatibility::STRICT ||
                F->arg_size() > ci_arg_size) {
                // too few arguments
                return false;
            }
        }

        if (!F->getReturnType()->canLosslesslyBitCastTo(CI->getType())) {
            // it showed up that the loosless bitcast is too strict
            // alternative since we can use the constexpr castings
            if (!(isPointerOrIntegerTy(F->getReturnType()) &&
                  isPointerOrIntegerTy(CI->getType()))) {
                return false;
            }
        }
    }

    size_t idx = 0;
    for (auto A = F->arg_begin(), E = F->arg_end(); idx < ci_arg_size && A != E;
         ++A, ++idx) {
        Type *CTy = CI->getArgOperand(idx)->getType();
        Type *ATy = A->getType();

        if (!(isPointerOrIntegerTy(CTy) && isPointerOrIntegerTy(ATy)))
            if (!CTy->canLosslesslyBitCastTo(ATy)) {
                return false;
            }
    }

    return true;
}